

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O0

int linfload(osfildef *fp,dbgcxdef *dbgctx,errcxdef *ec,tokpdef *path)

{
  int iVar1;
  size_t sVar2;
  linfdef *plVar3;
  char *pcVar4;
  unsigned_long uVar5;
  uchar *__ptr;
  long *in_RDX;
  long in_RSI;
  FILE *in_RDI;
  mcmon *objn;
  uchar *objp;
  uint pgcnt;
  uchar buf [261];
  linfdef *linf;
  int in_stack_00000ee4;
  tokpdef *in_stack_00000ee8;
  int in_stack_00000ef4;
  char *in_stack_00000ef8;
  errcxdef *in_stack_00000f00;
  mcmcxdef *in_stack_00000f08;
  int in_stack_00000f20;
  int in_stack_fffffffffffffeac;
  errcxdef *in_stack_fffffffffffffeb0;
  mcmcxdef *ctx;
  char *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  byte local_138;
  byte local_137;
  undefined1 auStack_136 [4];
  undefined1 auStack_132 [18];
  int in_stack_fffffffffffffee0;
  mcmon in_stack_fffffffffffffee6;
  mcmon *in_stack_fffffffffffffee8;
  ushort in_stack_fffffffffffffef6;
  mcmcxdef *in_stack_fffffffffffffef8;
  
  sVar2 = fread(&local_138,6,1,in_RDI);
  if ((sVar2 != 1) || (sVar2 = fread(auStack_132,(long)(int)(uint)local_137,1,in_RDI), sVar2 != 1))
  {
    return 1;
  }
  plVar3 = linfini(in_stack_00000f08,in_stack_00000f00,in_stack_00000ef8,in_stack_00000ef4,
                   in_stack_00000ee8,in_stack_00000ee4,in_stack_00000f20);
  if (plVar3 == (linfdef *)0x0) {
    pcVar4 = errstr((errcxdef *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                    in_stack_fffffffffffffeb8,(int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
    *(char **)(*in_RDX + 0x18) = pcVar4;
    *(undefined4 *)(*in_RDX + 0x68) = 1;
    errlogn(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,(char *)0x11c201);
    return 1;
  }
  if (plVar3->linffp != (osfildef *)0x0) {
    fclose((FILE *)plVar3->linffp);
    plVar3->linffp = (osfildef *)0x0;
  }
  (plVar3->linflin).linnxt = *(lindef **)(in_RSI + 0x20);
  *(linfdef **)(in_RSI + 0x20) = plVar3;
  (plVar3->linflin).linid = (uint)local_138;
  uVar5 = osrp4(auStack_136);
  plVar3->linfcrec = uVar5;
  if (*(int *)(in_RSI + 0x30) <= (int)(uint)local_138) {
    *(uint *)(in_RSI + 0x30) = local_138 + 1;
  }
  if (plVar3->linfcrec == 0) {
    return 0;
  }
  iVar1 = (int)(plVar3->linfcrec - 1 >> 10) + 1;
  ctx = (mcmcxdef *)plVar3->linfpg;
  while( true ) {
    if (iVar1 == 0) {
      return 0;
    }
    __ptr = mcmalo0(in_stack_fffffffffffffef8,in_stack_fffffffffffffef6,in_stack_fffffffffffffee8,
                    in_stack_fffffffffffffee6,in_stack_fffffffffffffee0);
    sVar2 = fread(__ptr,0x1000,1,in_RDI);
    if (sVar2 != 1) break;
    mcmunlck(ctx,(mcmon)((uint)in_stack_fffffffffffffeac >> 0x10));
    ctx = (mcmcxdef *)((long)&ctx->mcmcxgl + 2);
    iVar1 = iVar1 + -1;
  }
  return 1;
}

Assistant:

int linfload(osfildef *fp, dbgcxdef *dbgctx, errcxdef *ec, tokpdef *path)
{
    linfdef *linf;
    uchar    buf[UCHAR_MAX + 6];
    uint     pgcnt;
    uchar   *objp;
    mcmon   *objn;
    
    /* read the source's description from the file */
    if (osfrb(fp, buf, 6)
        || osfrb(fp, buf + 6, (int)buf[1]))
        return TRUE;
    
    /* initialize the linfdef */
    if (!(linf = linfini(dbgctx->dbgcxmem, ec, (char *)buf + 6,
                         (int)buf[1], path, FALSE, FALSE)))
    {
        errlog1(ec, ERR_NOSOURC, ERRTSTR,
                errstr(ec, (char *)buf+6, (int)buf[1]));
        return TRUE;
    }
    
    /* if we opened the file, close it - don't hold all files open */
    if (linf->linffp != 0)
    {
        osfcls(linf->linffp);
        linf->linffp = 0;
    }
    
    /* link into debug line source chain */
    linf->linflin.linnxt = dbgctx->dbgcxlin;
    dbgctx->dbgcxlin = &linf->linflin;
    linf->linflin.linid = buf[0];
    linf->linfcrec = osrp4(buf + 2);
    
    /* make sure the max line id is set above current line */
    if (buf[0] >= dbgctx->dbgcxfid)
        dbgctx->dbgcxfid = buf[0] + 1;
    
    /* make sure we have some debug records */
    if (!linf->linfcrec)
        return FALSE;

    /* figure number of pages */
    pgcnt = 1 + ((linf->linfcrec - 1) >> 10);
    
    /* allocate and read the debug source pages */
    for (objn = linf->linfpg ; pgcnt ; ++objn, --pgcnt)
    {
        objp = mcmalo(linf->linfmem, (ushort)(1024 * DBGLINFSIZ), objn);
        if (osfrb(fp, objp, (1024 * DBGLINFSIZ))) return(TRUE);
        mcmunlck(linf->linfmem, *objn);
    }

    /* success */
    return FALSE;
}